

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

double regularizer_direction_magnitude<sparse_parameters>
                 (vw *param_1,bfgs *b,double regularizer,sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  double dVar4;
  double dVar5;
  
  p_Var3 = (weights->_map)._M_h._M_before_begin._M_nxt;
  if (b->regularizers == (weight *)0x0) {
    if (p_Var3 == (_Hash_node_base *)0x0) {
      return 0.0;
    }
    dVar4 = 0.0;
    do {
      p_Var1 = p_Var3 + 2;
      p_Var3 = p_Var3->_M_nxt;
      dVar5 = (double)*(float *)&p_Var1->_M_nxt[1]._M_nxt;
      dVar4 = dVar4 + dVar5 * regularizer * dVar5;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  else {
    if (p_Var3 == (_Hash_node_base *)0x0) {
      return 0.0;
    }
    dVar4 = 0.0;
    do {
      p_Var1 = p_Var3 + 1;
      p_Var2 = p_Var3 + 2;
      p_Var3 = p_Var3->_M_nxt;
      dVar5 = (double)*(float *)&p_Var2->_M_nxt[1]._M_nxt;
      dVar4 = dVar4 + (double)b->regularizers
                              [((ulong)p_Var1->_M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * 2]
                      * dVar5 * dVar5;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return dVar4;
}

Assistant:

double regularizer_direction_magnitude(vw& /* all */, bfgs& b, double regularizer, T& weights)
{
  double ret = 0.;
  if (b.regularizers == nullptr)
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += regularizer * (&(*iter))[W_DIR] * (&(*iter))[W_DIR];

  else
  {
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += ((double)b.regularizers[2 * (iter.index() >> weights.stride_shift())]) * (&(*iter))[W_DIR] *
          (&(*iter))[W_DIR];
  }
  return ret;
}